

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O3

void lj_record_tailcall(jit_State *J,BCReg func,ptrdiff_t nargs)

{
  ulong uVar1;
  TRef *pTVar2;
  BCReg BVar3;
  int iVar4;
  
  rec_call_setup(J,func,nargs);
  uVar1 = J->L->base[-1].u64;
  if (((uint)uVar1 & 7) == 3) {
    iVar4 = J->framedepth;
    J->framedepth = iVar4 + -1;
    if (iVar4 < 1) {
      lj_trace_err(J,LJ_TRERR_NYIRETL);
    }
    iVar4 = (int)(uVar1 >> 3);
    BVar3 = J->baseslot - iVar4;
    J->baseslot = BVar3;
    J->base = (TRef *)((long)J->base - (uVar1 >> 1 & 0x3fffffffc));
    func = func + iVar4;
  }
  else {
    BVar3 = J->baseslot;
  }
  pTVar2 = J->base;
  if (BVar3 == 2) {
    pTVar2[func + 1] = 0x10000;
  }
  memmove(pTVar2 + -2,pTVar2 + func,(ulong)(J->maxslot + 2) << 2);
  iVar4 = J->tailcalled;
  J->tailcalled = iVar4 + 1;
  if (iVar4 < J->loopunroll) {
    return;
  }
  lj_trace_err(J,LJ_TRERR_LUNROLL);
}

Assistant:

void lj_record_tailcall(jit_State *J, BCReg func, ptrdiff_t nargs)
{
  rec_call_setup(J, func, nargs);
  if (frame_isvarg(J->L->base - 1)) {
    BCReg cbase = (BCReg)frame_delta(J->L->base - 1);
    if (--J->framedepth < 0)
      lj_trace_err(J, LJ_TRERR_NYIRETL);
    J->baseslot -= (BCReg)cbase;
    J->base -= cbase;
    func += cbase;
  }
  /* Move func + args down. */
  if (LJ_FR2 && J->baseslot == 2)
    J->base[func+1] = TREF_FRAME;
  memmove(&J->base[-1-LJ_FR2], &J->base[func], sizeof(TRef)*(J->maxslot+1+LJ_FR2));
  /* Note: the new TREF_FRAME is now at J->base[-1] (even for slot #0). */
  /* Tailcalls can form a loop, so count towards the loop unroll limit. */
  if (++J->tailcalled > J->loopunroll)
    lj_trace_err(J, LJ_TRERR_LUNROLL);
}